

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_db.cpp
# Opt level: O1

bool __thiscall
Fossilize::ConcurrentDatabase::set_bucket_path
          (ConcurrentDatabase *this,char *bucket_dirname_,char *bucket_basename_)

{
  char *pcVar1;
  
  if (bucket_dirname_ == (char *)0x0) {
    (this->bucket_dirname)._M_string_length = 0;
    *(this->bucket_dirname)._M_dataplus._M_p = '\0';
  }
  else {
    pcVar1 = (char *)(this->bucket_dirname)._M_string_length;
    strlen(bucket_dirname_);
    std::__cxx11::string::_M_replace((ulong)&this->bucket_dirname,0,pcVar1,(ulong)bucket_dirname_);
  }
  if (bucket_basename_ == (char *)0x0) {
    (this->bucket_basename)._M_string_length = 0;
    *(this->bucket_basename)._M_dataplus._M_p = '\0';
  }
  else {
    pcVar1 = (char *)(this->bucket_basename)._M_string_length;
    strlen(bucket_basename_);
    std::__cxx11::string::_M_replace((ulong)&this->bucket_basename,0,pcVar1,(ulong)bucket_basename_)
    ;
  }
  return true;
}

Assistant:

bool set_bucket_path(const char *bucket_dirname_, const char *bucket_basename_) override
	{
		if (bucket_dirname_)
			bucket_dirname = bucket_dirname_;
		else
			bucket_dirname.clear();

		if (bucket_basename_)
			bucket_basename = bucket_basename_;
		else
			bucket_basename.clear();

		return true;
	}